

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.h
# Opt level: O2

void __thiscall adios2::query::RangeTree::Print(RangeTree *this)

{
  pointer pRVar1;
  RangeTree *pRVar2;
  RangeTree *pRVar3;
  pointer pRVar4;
  Range leaf;
  undefined1 local_60 [56];
  
  pRVar1 = (this->m_Leaves).
           super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar4 = (this->m_Leaves).
                super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>.
                _M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1) {
    Range::Range((Range *)local_60,pRVar4);
    Range::Print((Range *)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 8));
  }
  pRVar2 = (this->m_SubNodes).
           super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar3 = (this->m_SubNodes).
                super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar2; pRVar3 = pRVar3 + 1) {
    RangeTree((RangeTree *)local_60,pRVar3);
    Print((RangeTree *)local_60);
    ~RangeTree((RangeTree *)local_60);
  }
  return;
}

Assistant:

void Print()
    {
        for (auto leaf : m_Leaves)
            leaf.Print();
        for (auto node : m_SubNodes)
            node.Print();
    }